

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

ExtKeyType cfd::js::api::HDWalletStructApi::ConvertExtKeyType(string *key_type)

{
  bool bVar1;
  CfdException *this;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  ExtKeyType local_14;
  string *psStack_10;
  ExtKeyType result;
  string *key_type_local;
  
  psStack_10 = key_type;
  bVar1 = std::operator==(key_type,"extPrivkey");
  if (bVar1) {
    local_14 = kExtPrivkey;
  }
  else {
    bVar1 = std::operator==(psStack_10,"extPubkey");
    if (!bVar1) {
      local_30.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp"
                   ,0x2f);
      local_30.filename = local_30.filename + 1;
      local_30.line = 0x191;
      local_30.funcname = "ConvertExtKeyType";
      core::logger::warn<std::__cxx11::string_const&>
                (&local_30,"Failed to ExtKeyType. Invalid extkeyType passed: extkey_type={}",
                 psStack_10);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50,
                 "Invalid extkeyType passed. extkeyType must be \"extPrivkey\" or \"extPubkey\".",
                 &local_51);
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    local_14 = kExtPubkey;
  }
  return local_14;
}

Assistant:

ExtKeyType HDWalletStructApi::ConvertExtKeyType(const std::string& key_type) {
  ExtKeyType result;
  if (key_type == "extPrivkey") {
    result = ExtKeyType::kExtPrivkey;
  } else if (key_type == "extPubkey") {
    result = ExtKeyType::kExtPubkey;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ExtKeyType. Invalid extkeyType passed: "
        "extkey_type={}",  // NOLINT
        key_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid extkeyType passed. extkeyType must be "
        "\"extPrivkey\" or \"extPubkey\".");
  }
  return result;
}